

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowMetricsWindow::Funcs::NodeDrawCmdShowMeshAndBoundingBox
               (ImGuiWindow *window,ImDrawList *draw_list,ImDrawCmd *draw_cmd,int elem_offset,
               bool show_mesh,bool show_aabb)

{
  ImDrawListFlags IVar1;
  ImDrawVert *pIVar2;
  uint in_ECX;
  int *in_RDX;
  long in_RSI;
  ImGuiWindow *in_RDI;
  byte in_R8B;
  byte in_R9B;
  ImVec2 p;
  int n;
  ImVec2 triangle [3];
  uint base_idx;
  ImDrawListFlags backup_flags;
  ImRect vtxs_rect;
  ImRect clip_rect;
  uint *idx_buffer;
  ImDrawList *fg_draw_list;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  ImVector<ImDrawVert> *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  ImVec2 *local_d0;
  undefined8 local_c8;
  byte local_a5;
  ImVec2 in_stack_ffffffffffffff7c;
  float thickness;
  int in_stack_ffffffffffffff84;
  float in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  ImVec2 *in_stack_ffffffffffffff90;
  ImVec2 *in_stack_ffffffffffffff98;
  ImVec2 in_stack_ffffffffffffffa0;
  uint local_58;
  ImRect local_50 [2];
  undefined8 local_30;
  ImDrawList *local_28;
  byte local_1e;
  byte local_1d;
  uint local_1c;
  int *local_18;
  long local_10;
  
  local_1d = in_R8B & 1;
  local_1e = in_R9B & 1;
  local_a5 = 1;
  if (local_1d == 0) {
    local_a5 = local_1e;
  }
  if (local_a5 == 0) {
    __assert_fail("show_mesh || show_aabb",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x27df,
                  "static void ImGui::ShowMetricsWindow(bool *)::Funcs::NodeDrawCmdShowMeshAndBoundingBox(ImGuiWindow *, const ImDrawList *, const ImDrawCmd *, int, bool, bool)"
                 );
  }
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28 = GetForegroundDrawList(in_RDI);
  if (*(int *)(local_10 + 0x10) < 1) {
    local_c8 = 0;
  }
  else {
    local_c8 = *(undefined8 *)(local_10 + 0x18);
  }
  local_30 = local_c8;
  ImRect::ImRect((ImRect *)in_stack_ffffffffffffff00,
                 (ImVec4 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 (float)((ulong)in_stack_ffffffffffffff08 >> 0x20),(float)in_stack_ffffffffffffff08,
                 (float)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                 SUB84(in_stack_ffffffffffffff00,0));
  IVar1 = local_28->Flags;
  local_28->Flags = local_28->Flags & 0xfffffffe;
  for (local_58 = local_1c; thickness = in_stack_ffffffffffffff7c.y, local_58 < local_1c + *local_18
      ; local_58 = local_58 + 3) {
    local_d0 = (ImVec2 *)&stack0xffffffffffffff88;
    do {
      ImVec2::ImVec2(local_d0);
      local_d0 = local_d0 + 1;
    } while (local_d0 != (ImVec2 *)&stack0xffffffffffffffa0);
    for (in_stack_ffffffffffffff84 = 0; in_stack_ffffffffffffff84 < 3;
        in_stack_ffffffffffffff84 = in_stack_ffffffffffffff84 + 1) {
      pIVar2 = ImVector<ImDrawVert>::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffefc)
      ;
      in_stack_ffffffffffffff7c = pIVar2->pos;
      *(ImVec2 *)(&stack0xffffffffffffff88 + (long)in_stack_ffffffffffffff84 * 8) =
           in_stack_ffffffffffffff7c;
      ImRect::Add(local_50,(ImVec2 *)&stack0xffffffffffffff7c);
    }
    if ((local_1d & 1) != 0) {
      ImDrawList::AddPolyline(local_28,(ImVec2 *)&stack0xffffffffffffff88,3,0xff00ffff,true,1.0);
    }
  }
  if ((local_1e & 1) != 0) {
    ImFloor((ImVec2 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    ImFloor((ImVec2 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    ImDrawList::AddRect((ImDrawList *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                        in_stack_ffffffffffffff90,(ImU32)in_stack_ffffffffffffff8c,
                        in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,thickness);
    ImFloor((ImVec2 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    ImFloor((ImVec2 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    ImDrawList::AddRect((ImDrawList *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                        in_stack_ffffffffffffff90,(ImU32)in_stack_ffffffffffffff8c,
                        in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,thickness);
  }
  local_28->Flags = IVar1;
  return;
}

Assistant:

static void NodeDrawCmdShowMeshAndBoundingBox(ImGuiWindow* window, const ImDrawList* draw_list, const ImDrawCmd* draw_cmd, int elem_offset, bool show_mesh, bool show_aabb)
        {
            IM_ASSERT(show_mesh || show_aabb);
            ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
            ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;

            // Draw wire-frame version of all triangles
            ImRect clip_rect = draw_cmd->ClipRect;
            ImRect vtxs_rect(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
            ImDrawListFlags backup_flags = fg_draw_list->Flags;
            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
            for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + draw_cmd->ElemCount); base_idx += 3)
            {
                ImVec2 triangle[3];
                for (int n = 0; n < 3; n++)
                {
                    ImVec2 p = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                    triangle[n] = p;
                    vtxs_rect.Add(p);
                }
                if (show_mesh)
                    fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), true, 1.0f); // In yellow: mesh triangles
            }
            // Draw bounding boxes
            if (show_aabb)
            {
                fg_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255, 0, 255, 255)); // In pink: clipping rectangle submitted to GPU
                fg_draw_list->AddRect(ImFloor(vtxs_rect.Min), ImFloor(vtxs_rect.Max), IM_COL32(0, 255, 255, 255)); // In cyan: bounding box of triangles
            }
            fg_draw_list->Flags = backup_flags;
        }